

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::DebugFindPkgRAII::DebugFindPkgRAII(DebugFindPkgRAII *this,cmMakefile *mf,string *pkg)

{
  bool bVar1;
  cmake *this_00;
  string *pkg_local;
  cmMakefile *mf_local;
  DebugFindPkgRAII *this_local;
  
  this->Makefile = mf;
  this->OldValue = (bool)(this->Makefile->DebugFindPkg & 1);
  this_00 = GetCMakeInstance(this->Makefile);
  bVar1 = cmake::GetDebugFindPkgOutput(this_00,pkg);
  this->Makefile->DebugFindPkg = bVar1;
  return;
}

Assistant:

cmMakefile::DebugFindPkgRAII::DebugFindPkgRAII(cmMakefile* mf,
                                               std::string const& pkg)
  : Makefile(mf)
  , OldValue(this->Makefile->DebugFindPkg)
{
  this->Makefile->DebugFindPkg =
    this->Makefile->GetCMakeInstance()->GetDebugFindPkgOutput(pkg);
}